

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigSplit.c
# Opt level: O0

Aig_Obj_t * Aig_NodeBddToMuxes_rec(DdManager *dd,DdNode *bFunc,Aig_Man_t *pNew,st__table *tBdd2Node)

{
  Aig_Obj_t *table;
  int iVar1;
  DdNode *key;
  Aig_Obj_t *local_50;
  Aig_Obj_t *pNodeC;
  Aig_Obj_t *pNode1;
  Aig_Obj_t *pNode0;
  Aig_Obj_t *pNode;
  st__table *tBdd2Node_local;
  Aig_Man_t *pNew_local;
  DdNode *bFunc_local;
  DdManager *dd_local;
  
  pNode = (Aig_Obj_t *)tBdd2Node;
  tBdd2Node_local = (st__table *)pNew;
  pNew_local = (Aig_Man_t *)bFunc;
  bFunc_local = &dd->sentinel;
  if (((ulong)bFunc & 1) != 0) {
    __assert_fail("!Cudd_IsComplement(bFunc)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigSplit.c"
                  ,0x37,
                  "Aig_Obj_t *Aig_NodeBddToMuxes_rec(DdManager *, DdNode *, Aig_Man_t *, st__table *)"
                 );
  }
  iVar1 = st__lookup(tBdd2Node,(char *)bFunc,(char **)&pNode0);
  if (iVar1 == 0) {
    pNode1 = Aig_NodeBddToMuxes_rec
                       ((DdManager *)bFunc_local,
                        (DdNode *)((ulong)pNew_local->vCos & 0xfffffffffffffffe),
                        (Aig_Man_t *)tBdd2Node_local,(st__table *)pNode);
    pNode1 = Aig_NotCond(pNode1,(uint)pNew_local->vCos & 1);
    pNodeC = Aig_NodeBddToMuxes_rec
                       ((DdManager *)bFunc_local,(DdNode *)pNew_local->vCis,
                        (Aig_Man_t *)tBdd2Node_local,(st__table *)pNode);
    table = pNode;
    key = Cudd_bddIthVar((DdManager *)bFunc_local,*(int *)&pNew_local->pName);
    iVar1 = st__lookup((st__table *)table,(char *)key,(char **)&local_50);
    if (iVar1 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigSplit.c"
                    ,0x3f,
                    "Aig_Obj_t *Aig_NodeBddToMuxes_rec(DdManager *, DdNode *, Aig_Man_t *, st__table *)"
                   );
    }
    pNode0 = Aig_Mux((Aig_Man_t *)tBdd2Node_local,local_50,pNodeC,pNode1);
    st__insert((st__table *)pNode,(char *)pNew_local,(char *)pNode0);
    dd_local = (DdManager *)pNode0;
  }
  else {
    dd_local = (DdManager *)pNode0;
  }
  return (Aig_Obj_t *)dd_local;
}

Assistant:

Aig_Obj_t * Aig_NodeBddToMuxes_rec( DdManager * dd, DdNode * bFunc, Aig_Man_t * pNew, st__table * tBdd2Node )
{
    Aig_Obj_t * pNode, * pNode0, * pNode1, * pNodeC;
    assert( !Cudd_IsComplement(bFunc) );
    if ( st__lookup( tBdd2Node, (char *)bFunc, (char **)&pNode ) )
        return pNode;
    // solve for the children nodes
    pNode0 = Aig_NodeBddToMuxes_rec( dd, Cudd_Regular(cuddE(bFunc)), pNew, tBdd2Node );
    pNode0 = Aig_NotCond( pNode0, Cudd_IsComplement(cuddE(bFunc)) );
    pNode1 = Aig_NodeBddToMuxes_rec( dd, cuddT(bFunc), pNew, tBdd2Node );
    if ( ! st__lookup( tBdd2Node, (char *)Cudd_bddIthVar(dd, bFunc->index), (char **)&pNodeC ) )
        assert( 0 );
    // create the MUX node
    pNode = Aig_Mux( pNew, pNodeC, pNode1, pNode0 );
    st__insert( tBdd2Node, (char *)bFunc, (char *)pNode );
    return pNode;
}